

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::x86::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  uint32_t *puVar1;
  FuncValue *pFVar2;
  undefined8 *puVar3;
  BaseCompiler *pBVar4;
  OperandPack *pOVar5;
  BaseRAPass *pBVar6;
  BaseBuilder *pBVar7;
  VirtReg *pVVar8;
  FuncNode *pFVar9;
  Error EVar10;
  Error EVar11;
  Error EVar12;
  Error EVar13;
  uint uVar14;
  undefined8 extraout_RAX;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint32_t uVar18;
  InvokeNode *invokeNode_00;
  ulong uVar19;
  FuncValuePack *pFVar20;
  Error in_R10D;
  long lVar21;
  int iVar22;
  Imm *imm_;
  long lVar23;
  bool bVar24;
  Reg dst;
  RAWorkReg *workReg;
  RAWorkReg *workReg_1;
  Operand_ local_78;
  Operand_ local_68;
  uint local_4c;
  RAWorkReg *local_48;
  ulong local_40;
  FuncValue *local_38;
  
  local_40 = (ulong)(invokeNode->_funcDetail)._argCount;
  pBVar4 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
  uVar14 = (pBVar4->super_BaseBuilder).super_BaseEmitter._gpRegInfo._signature;
  (pBVar4->super_BaseBuilder)._cursor =
       (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
  if (local_40 == 0) {
    bVar24 = true;
  }
  else {
    local_4c = uVar14 >> 3 & 0x1f;
    pFVar20 = (invokeNode->_funcDetail)._args;
    lVar21 = 0;
    uVar19 = 0;
    do {
      if (uVar19 == 0x10) {
LAB_00135a0c:
        onBeforeInvoke();
LAB_00135a11:
        onBeforeInvoke();
        goto LAB_00135a16;
      }
      lVar17 = 0;
      lVar23 = lVar21;
      do {
        uVar14 = *(uint *)((long)&pFVar20->_values[0]._data + lVar17);
        EVar13 = 5;
        if (uVar14 == 0) break;
        if ((invokeNode->_funcDetail)._argCount <= (byte)uVar19) {
          onBeforeInvoke();
          goto LAB_00135a0c;
        }
        pOVar5 = invokeNode->_args;
        uVar15 = *(uint *)((long)pOVar5->_data[0]._data + lVar17 * 4 + lVar21 + -8);
        if (uVar15 == 0) {
          EVar13 = 7;
          EVar12 = in_R10D;
        }
        else {
          pFVar2 = (FuncValue *)((long)&pFVar20->_values[0]._data + lVar17);
          imm_ = (Imm *)((long)pOVar5->_data[0]._data + lVar23 + -8);
          uVar15 = uVar15 & 7;
          if (uVar15 == 3) {
            if ((uVar14 >> 8 & 1) == 0) {
              EVar12 = moveImmToStackArg(this,(InvokeNode *)this,pFVar2,imm_);
              EVar13 = 1;
              EVar11 = in_R10D;
              EVar10 = EVar12;
              goto joined_r0x001352ea;
            }
            local_78._signature = 1;
            local_78._baseId = 0xff;
            local_78._data[0] = 0;
            local_78._data[1] = 0;
            EVar12 = moveImmToRegArg(this,(InvokeNode *)this,pFVar2,imm_,(BaseReg *)&local_78);
            if (EVar12 == 0) {
              puVar3 = (undefined8 *)
                       ((long)invokeNode->_args->_data[0]._data + lVar17 * 4 + lVar21 + -8);
              *puVar3 = CONCAT44(local_78._baseId,local_78._signature);
              puVar3[1] = CONCAT44(local_78._data[1],local_78._data[0]);
              goto LAB_00135417;
            }
            EVar13 = 1;
          }
          else {
            if (uVar15 == 1) {
              pBVar6 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
              uVar15 = *(int *)((long)pOVar5->_data[0]._data + lVar17 * 4 + lVar21 + -4) - 0x100;
              pBVar7 = (pBVar6->super_FuncPass).super_Pass._cb;
              uVar14._0_1_ = pBVar7[1].super_BaseEmitter._environment._arch;
              uVar14._1_1_ = pBVar7[1].super_BaseEmitter._environment._subArch;
              uVar14._2_1_ = pBVar7[1].super_BaseEmitter._environment._vendor;
              uVar14._3_1_ = pBVar7[1].super_BaseEmitter._environment._platform;
              local_38 = pFVar2;
              if (uVar15 < uVar14) {
                pVVar8 = (VirtReg *)
                         pBVar7[1].super_BaseEmitter._errorHandler[uVar15]._vptr_ErrorHandler;
                local_68._0_8_ = pVVar8->_workReg;
                EVar12 = 0;
                if ((RAWorkReg *)local_68._0_8_ == (RAWorkReg *)0x0) {
                  EVar12 = BaseRAPass::_asWorkReg(pBVar6,pVVar8,(RAWorkReg **)&local_68);
                }
              }
              else {
                EVar12 = 0x1f;
              }
              pFVar2 = local_38;
              EVar13 = 1;
              EVar11 = EVar12;
              EVar10 = EVar13;
              if (EVar12 == 0) {
                uVar14 = local_38->_data;
                if ((uVar14 >> 8 & 1) == 0) {
                  if ((uVar14 >> 10 & 1) == 0) {
                    EVar12 = moveRegToStackArg(this,(InvokeNode *)this,local_38,(BaseReg *)imm_);
                  }
                  else {
                    uVar14 = *(uint *)((long)pOVar5->_data[0]._data + lVar17 * 4 + lVar21 + -8);
                    if ((uVar14 & 0xf00) == 0) {
                      EVar12 = 0x1a;
                      EVar11 = 0x1a;
                      if ((uVar14 >> 3 & 0x1f) == local_4c) {
                        EVar12 = moveRegToStackArg(this,(InvokeNode *)this,local_38,(BaseReg *)imm_)
                        ;
                        EVar13 = 1;
                        EVar11 = EVar12;
                        EVar10 = EVar13;
                        if (EVar12 == 0) {
                          EVar13 = 7;
                          EVar12 = in_R10D;
                          EVar11 = in_R10D;
                          EVar10 = EVar13;
                        }
                      }
                      goto joined_r0x001352ea;
                    }
                    local_78._signature = 1;
                    local_78._baseId = 0xff;
                    local_78._data[0] = 0;
                    local_78._data[1] = 0;
                    invokeNode_00 = invokeNode;
                    moveVecToPtr(this,invokeNode,local_38,(Vec *)imm_,(BaseReg *)&local_78);
                    EVar12 = moveRegToStackArg(this,invokeNode_00,pFVar2,(BaseReg *)&local_78);
                  }
                  EVar11 = EVar12;
                  if (EVar12 == 0) {
LAB_001355bb:
                    EVar13 = 0;
                    EVar12 = in_R10D;
                    EVar11 = in_R10D;
                    EVar10 = EVar13;
                  }
                }
                else {
                  if (0x1fffffff < uVar14) goto LAB_00135a11;
                  if ((uVar14 >> 10 & 1) == 0) {
                    if (((((RegInfo *)(local_68._0_8_ + 0x20))->_signature ^
                         *(uint *)(_archTraits + (ulong)(uVar14 >> 0x18) * 4 + 0xe8)) & 0xf00) == 0)
                    {
                      EVar13 = 0;
                      bVar24 = true;
                    }
                    else {
                      bVar24 = false;
                      in_R10D = 0x1a;
                    }
                  }
                  else {
                    uVar14 = *(uint *)((long)pOVar5->_data[0]._data + lVar17 * 4 + lVar21 + -8);
                    if ((uVar14 & 0xf00) == 0) {
                      bVar24 = (uVar14 >> 3 & 0x1f) == local_4c;
                      EVar13 = 1;
                      if (bVar24) {
                        EVar13 = 7;
                      }
                      if (!bVar24) {
                        in_R10D = 0x1a;
                      }
                      bVar24 = false;
                    }
                    else {
                      local_78._signature = 1;
                      local_78._baseId = 0xff;
                      local_78._data[0] = 0;
                      local_78._data[1] = 0;
                      moveVecToPtr(this,invokeNode,local_38,(Vec *)imm_,(BaseReg *)&local_78);
                      puVar3 = (undefined8 *)
                               ((long)invokeNode->_args->_data[0]._data + lVar17 * 4 + lVar21 + -8);
                      *puVar3 = CONCAT44(local_78._baseId,local_78._signature);
                      puVar3[1] = CONCAT44(local_78._data[1],local_78._data[0]);
                      EVar13 = 0;
                      bVar24 = true;
                    }
                  }
                  EVar12 = in_R10D;
                  EVar11 = in_R10D;
                  EVar10 = EVar13;
                  if (bVar24) goto LAB_001355bb;
                }
              }
joined_r0x001352ea:
              in_R10D = EVar11;
              if (EVar10 != 0) goto LAB_00135419;
            }
LAB_00135417:
            EVar13 = 0;
            EVar12 = in_R10D;
          }
        }
LAB_00135419:
        in_R10D = EVar12;
        if ((EVar13 != 7) && (EVar13 != 0)) break;
        lVar17 = lVar17 + 4;
        lVar23 = lVar23 + 0x10;
        EVar13 = 5;
      } while (lVar17 != 0x10);
      if (EVar13 == 5) {
        EVar13 = 0;
      }
      if (EVar13 != 0) goto LAB_00135600;
      uVar19 = uVar19 + 1;
      pFVar20 = pFVar20 + 1;
      lVar21 = lVar21 + 0x40;
    } while (uVar19 != local_40);
    EVar13 = 2;
LAB_00135600:
    bVar24 = EVar13 == 2;
  }
  if (bVar24) {
    pBVar4 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
    (pBVar4->super_BaseBuilder)._cursor = (BaseNode *)invokeNode;
    if (((invokeNode->_funcDetail)._callConv._flags & 1) != 0) {
      local_78._signature = (pBVar4->super_BaseBuilder).super_BaseEmitter._gpRegInfo._signature;
      local_78._baseId = 4;
      local_78._data[0] = 0;
      local_78._data[1] = 0;
      local_68._0_8_ = (RAWorkReg *)0x3;
      local_68._data[1] = 0;
      local_68._data[0] = (invokeNode->_funcDetail)._argStackSize;
      EVar13 = BaseEmitter::_emitI((BaseEmitter *)pBVar4,0x2f6,&local_78,&local_68);
      if (EVar13 != 0) {
        return EVar13;
      }
    }
    if ((invokeNode->_funcDetail)._rets._values[0]._data != 0) {
      lVar21 = 0;
      do {
        EVar13 = in_R10D;
        if (*(int *)((long)&(invokeNode->_funcDetail)._rets._values[0]._data + lVar21) == 0) {
          iVar22 = 0x16;
        }
        else {
          iVar22 = 0;
          if (((invokeNode->_rets)._data[0]._data[lVar21 + -2] & 7) == 1) {
            pBVar6 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
            uVar14 = (invokeNode->_rets)._data[0]._data[lVar21 + -1] - 0x100;
            pBVar7 = (pBVar6->super_FuncPass).super_Pass._cb;
            uVar15._0_1_ = pBVar7[1].super_BaseEmitter._environment._arch;
            uVar15._1_1_ = pBVar7[1].super_BaseEmitter._environment._subArch;
            uVar15._2_1_ = pBVar7[1].super_BaseEmitter._environment._vendor;
            uVar15._3_1_ = pBVar7[1].super_BaseEmitter._environment._platform;
            if (uVar14 < uVar15) {
              pVVar8 = (VirtReg *)
                       pBVar7[1].super_BaseEmitter._errorHandler[uVar14]._vptr_ErrorHandler;
              local_48 = pVVar8->_workReg;
              EVar13 = 0;
              if (local_48 == (RAWorkReg *)0x0) {
                EVar13 = BaseRAPass::_asWorkReg(pBVar6,pVVar8,&local_48);
              }
            }
            else {
              EVar13 = 0x1f;
            }
            iVar22 = 1;
            if (EVar13 == 0) {
              uVar14 = *(uint *)((long)&(invokeNode->_funcDetail)._rets._values[0]._data + lVar21);
              if ((uVar14 >> 8 & 1) == 0) {
LAB_00135761:
                iVar22 = 0;
                EVar13 = in_R10D;
              }
              else if (uVar14 >> 0x18 == 0x15) {
                uVar15 = (local_48->_info)._signature;
                if ((uVar15 & 0xf00) == 0x100) {
                  local_78._baseId = local_48->_virtId;
                  local_78._data[0] = 0;
                  local_78._data[1] = 0;
                  local_68._0_8_ = (RAWorkReg *)0x2;
                  local_68._data[0] = 0;
                  local_68._data[1] = 0;
                  uVar16 = (uint)(byte)Type::_typeData[local_48->_virtReg->_typeId];
                  if ((char)uVar14 != '\0') {
                    uVar16 = uVar14;
                  }
                  local_78._signature = uVar15;
                  if ((char)uVar16 == '+') {
                    EVar13 = BaseRAPass::useTemporaryMem
                                       ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass
                                        ,(BaseMem *)&local_68,8,4);
                    if (EVar13 == 0) {
                      local_68._signature._3_1_ = 8;
                      EVar13 = BaseEmitter::_emitI((BaseEmitter *)
                                                   (this->
                                                  super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                                  _cc,0xef,&local_68);
                      if (EVar13 == 0) {
                        uVar18 = 0x443;
                        if (this->_avxEnabled == false) {
                          uVar18 = 0x1c1;
                        }
                        EVar13 = BaseEmitter::_emitI((BaseEmitter *)
                                                     (this->
                                                  super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                                  _cc,uVar18,&local_78,&local_68);
LAB_00135968:
                        if (EVar13 == 0) {
                          bVar24 = true;
                          goto LAB_00135988;
                        }
                      }
                      goto LAB_00135985;
                    }
LAB_001358db:
                    in_R10D = EVar13;
                    bVar24 = false;
                  }
                  else if ((uVar16 & 0xff) == 0x2a) {
                    EVar13 = BaseRAPass::useTemporaryMem
                                       ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass
                                        ,(BaseMem *)&local_68,4,4);
                    if (EVar13 != 0) goto LAB_001358db;
                    local_68._signature._3_1_ = 4;
                    EVar13 = BaseEmitter::_emitI((BaseEmitter *)
                                                 (this->
                                                 super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc
                                                 ,0xef,&local_68);
                    if (EVar13 == 0) {
                      uVar18 = 0x446;
                      if (this->_avxEnabled == false) {
                        uVar18 = 0x1c4;
                      }
                      EVar13 = BaseEmitter::_emitI((BaseEmitter *)
                                                   (this->
                                                  super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                                  _cc,uVar18,&local_78,&local_68);
                      goto LAB_00135968;
                    }
LAB_00135985:
                    in_R10D = EVar13;
                    bVar24 = false;
                  }
                  else {
                    in_R10D = 0x1a;
                    bVar24 = false;
                  }
LAB_00135988:
                  EVar13 = in_R10D;
                  if (bVar24) goto LAB_00135761;
                }
                else {
                  EVar13 = 0x1a;
                }
              }
              else {
                if (0x1fffffff < uVar14) {
LAB_00135a16:
                  onBeforeInvoke();
                  __clang_call_terminate(extraout_RAX);
                }
                if (((*(uint *)(_archTraits + (ulong)(uVar14 >> 0x18) * 4 + 0xe8) ^
                     (local_48->_info)._signature) & 0xf00) == 0) goto LAB_00135761;
                EVar13 = 0x1a;
              }
            }
          }
        }
        in_R10D = EVar13;
        if (iVar22 != 0) goto LAB_001359b8;
        lVar21 = lVar21 + 4;
      } while (lVar21 != 0x10);
      iVar22 = 0x16;
LAB_001359b8:
      if (iVar22 != 0x16) {
        return in_R10D;
      }
    }
    puVar1 = &((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock)->_flags;
    *puVar1 = *puVar1 | 0x1000;
    pFVar9 = ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass)->_func;
    (pFVar9->_frame)._attributes = (pFVar9->_frame)._attributes | 0x20;
    uVar14 = (invokeNode->_funcDetail)._argStackSize;
    uVar15 = (pFVar9->_frame)._callStackSize;
    if (uVar14 < uVar15) {
      uVar14 = uVar15;
    }
    (pFVar9->_frame)._callStackSize = uVar14;
    in_R10D = 0;
  }
  return in_R10D;
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());
  uint32_t nativeRegType = cc()->_gpRegInfo.type();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          uint32_t regGroup = workReg->group();
          uint32_t argGroup = Reg::groupOf(arg.regType());

          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);
              // It's considered allocated if this is an indirect argument and the user used GP.
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            invokeNode->_args[argIndex][valueIndex] = indirectReg;
          }
          else {
            if (regGroup != argGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
        else {
          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);

              ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, indirectReg));
          }
          else {
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
          }
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);
  if (fd.hasFlag(CallConv::kFlagCalleePopsStack))
    ASMJIT_PROPAGATE(cc()->sub(cc()->zsp(), fd.argStackSize()));

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          if (ret.regType() == Reg::kTypeSt) {
            if (workReg->group() != Reg::kGroupVec)
              return DebugUtils::errored(kErrorInvalidAssignment);

            Reg dst = Reg::fromSignatureAndId(workReg->signature(), workReg->virtId());
            Mem mem;

            uint32_t typeId = Type::baseOf(workReg->typeId());
            if (ret.hasTypeId())
              typeId = ret.typeId();

            switch (typeId) {
              case Type::kIdF32:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
                mem.setSize(4);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), dst.as<Xmm>(), mem));
                break;

              case Type::kIdF64:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
                mem.setSize(8);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), dst.as<Xmm>(), mem));
                break;

              default:
                return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
          else {
            uint32_t regGroup = workReg->group();
            uint32_t retGroup = Reg::groupOf(ret.regType());

            if (regGroup != retGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlock::kFlagHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncFrame::kAttrHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}